

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O0

callback_t *
end_property_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error
                  )

{
  element_type *this;
  QLoggingCategory *pQVar1;
  char *category;
  QDebug *debug;
  element_type *peVar2;
  shared_ptr<MetaProperty> local_78 [2];
  QMessageLogger local_58;
  QDebug local_38 [15];
  bool local_29;
  int *piStack_28;
  bool qt_category_enabled;
  int *error_local;
  ifstream *f_local;
  MetaConfiguration *conf_local;
  
  piStack_28 = error;
  error_local = (int *)f;
  f_local = (ifstream *)conf;
  conf_local = (MetaConfiguration *)__return_storage_ptr__;
  this = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    (anonymous_namespace)::current_class);
  std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>::
  push_back(&this->properties,(value_type *)(anonymous_namespace)::current_property);
  pQVar1 = parser();
  local_29 = QLoggingCategory::isDebugEnabled(pQVar1);
  while (local_29 != false) {
    pQVar1 = parser();
    category = QLoggingCategory::categoryName(pQVar1);
    QMessageLogger::QMessageLogger(&local_58,(char *)0x0,0,(char *)0x0,category);
    QMessageLogger::debug();
    debug = QDebug::operator<<(local_38,"finishing property");
    peVar2 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(anonymous_namespace)::current_property);
    operator<<(debug,&peVar2->name);
    QDebug::~QDebug(local_38);
    local_29 = false;
  }
  std::shared_ptr<MetaProperty>::shared_ptr(local_78,(nullptr_t)0x0);
  std::shared_ptr<MetaProperty>::operator=
            ((shared_ptr<MetaProperty> *)(anonymous_namespace)::current_property,local_78);
  std::shared_ptr<MetaProperty>::~shared_ptr(local_78);
  std::
  function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
  ::
  function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
            ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
              *)__return_storage_ptr__,class_state);
  return __return_storage_ptr__;
}

Assistant:

callback_t end_property_state(MetaConfiguration &conf, std::ifstream &f,
                              int &error) {
  current_class->properties.push_back(current_property);
  qCDebug(parser) << "finishing property" << current_property->name;
  current_property = nullptr;
  return class_state;
}